

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::search_initialize(vw *all,search *sch)

{
  search_private *psVar1;
  stringstream *psVar2;
  
  psVar1 = sch->priv;
  psVar1->all = all;
  psVar1->active_csoaa = false;
  psVar1->label_is_test = mc_label_is_test;
  psVar1->num_learners = 1;
  psVar1->state = INITIALIZE;
  psVar1->mix_per_roll_policy = -2;
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2);
  psVar1->pred_string = (stringstream *)psVar2;
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2);
  psVar1->truth_string = (stringstream *)psVar2;
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2);
  psVar1->bad_string_stream = (stringstream *)psVar2;
  std::ios::clear((int)*(undefined8 *)(*(long *)psVar2 + -0x18) + (int)psVar2);
  psVar1->rollout_method = MIX_PER_ROLL;
  psVar1->rollin_method = MIX_PER_ROLL;
  psVar1->allow_current_policy = true;
  psVar1->adaptive_beta = true;
  psVar1->total_number_of_policies = 1;
  (psVar1->acset).max_bias_ngram_length = 1;
  (psVar1->acset).feature_value = 1.0;
  (psVar1->cache_hash_map).default_value.a = 0xffffffff;
  (psVar1->cache_hash_map).default_value.s = 0.0;
  v_array<v_hashmap<unsigned_char_*,_Search::scored_action>::hash_elem>::resize
            (&(psVar1->cache_hash_map).dat,0x3ff);
  (psVar1->cache_hash_map).last_position = 0;
  (psVar1->cache_hash_map).num_occupants = 0;
  (psVar1->cache_hash_map).equivalent = (_func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *)0x0;
  (psVar1->cache_hash_map).equivalent_no_data = (_func_bool_uchar_ptr_ptr_uchar_ptr_ptr *)0x0;
  (psVar1->cache_hash_map).default_value.a = 0xffffffff;
  (psVar1->cache_hash_map).default_value.s = 0.0;
  (psVar1->cache_hash_map).equivalent_no_data = cached_item_equivalent;
  (psVar1->cache_hash_map).eq_data = (void *)0x0;
  (psVar1->cache_hash_map).equivalent = (_func_bool_void_ptr_uchar_ptr_ptr_uchar_ptr_ptr *)0x0;
  sch->task_data = (void *)0x0;
  (psVar1->active_uncertainty).end_array = (pair<float,_unsigned_long> *)0x0;
  (psVar1->active_uncertainty).erase_count = 0;
  (psVar1->active_uncertainty)._begin = (pair<float,_unsigned_long> *)0x0;
  (psVar1->active_uncertainty)._end = (pair<float,_unsigned_long> *)0x0;
  (psVar1->active_known)._begin = (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0;
  (psVar1->active_known)._end = (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0;
  (psVar1->active_known).end_array = (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0;
  (psVar1->active_known).erase_count = 0;
  (*(code *)COST_SENSITIVE::cs_label)(&psVar1->empty_cs_label);
  (psVar1->rawOutputString)._M_dataplus._M_p = (pointer)&(psVar1->rawOutputString).field_2;
  (psVar1->rawOutputString)._M_string_length = 0;
  (psVar1->rawOutputString).field_2._M_local_buf[0] = '\0';
  psVar2 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar2,(string *)&psVar1->rawOutputString,_S_out|_S_in);
  psVar1->rawOutputStringStream = (stringstream *)psVar2;
  (psVar1->test_action_sequence).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (psVar1->test_action_sequence).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (psVar1->test_action_sequence).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&psVar1->dat_new_feature_audit_ss);
  return;
}

Assistant:

void search_initialize(vw* all, search& sch)
{
  search_private& priv = *sch.priv;  // priv is zero initialized by default
  priv.all = all;

  priv.active_csoaa = false;
  priv.label_is_test = mc_label_is_test;

  priv.num_learners = 1;
  priv.state = INITIALIZE;
  priv.mix_per_roll_policy = -2;

  priv.pred_string = new stringstream();
  priv.truth_string = new stringstream();
  priv.bad_string_stream = new stringstream();
  priv.bad_string_stream->clear(priv.bad_string_stream->badbit);

  priv.rollout_method = MIX_PER_ROLL;
  priv.rollin_method = MIX_PER_ROLL;

  priv.allow_current_policy = true;
  priv.adaptive_beta = true;

  priv.total_number_of_policies = 1;

  priv.acset.max_bias_ngram_length = 1;

  priv.acset.feature_value = 1.;

  scored_action sa((action)-1, 0.);
  new (&priv.cache_hash_map) v_hashmap<unsigned char*, scored_action>();
  priv.cache_hash_map.set_default_value(sa);
  priv.cache_hash_map.set_equivalent(cached_item_equivalent);

  sch.task_data = nullptr;

  priv.active_uncertainty = v_init<pair<float, size_t>>();
  priv.active_known = v_init<v_array<pair<CS::wclass&, bool>>>();

  CS::cs_label.default_label(&priv.empty_cs_label);

  new (&priv.rawOutputString) string();
  priv.rawOutputStringStream = new stringstream(priv.rawOutputString);
  new (&priv.test_action_sequence) vector<action>();
  new (&priv.dat_new_feature_audit_ss) stringstream();
}